

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

FileId decompress_single(uint8_t **ptrptr)

{
  uint uVar1;
  byte bVar2;
  byte *pbVar3;
  
  pbVar3 = *ptrptr;
  uVar1 = *pbVar3 & 0x7f;
  if ((char)*pbVar3 < '\0') {
    bVar2 = 7;
    do {
      pbVar3 = pbVar3 + 1;
      *ptrptr = pbVar3;
      uVar1 = uVar1 + ((*pbVar3 & 0x7f) << (bVar2 & 0x1f));
      bVar2 = bVar2 + 7;
    } while ((char)*pbVar3 < '\0');
  }
  *ptrptr = pbVar3 + 1;
  return uVar1;
}

Assistant:

FileId decompress_single(uint8_t **ptrptr) {
    uint32_t shift = 0;
    uint8_t *&ptr = *ptrptr;
    for (uint64_t acc = 0;; ptr++) {
        acc += (*ptr & 0x7FU) << shift;
        if ((*ptr & 0x80U) == 0) {
            ptr++;
            return acc;
        }
        shift += 7U;
    }
}